

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O1

void safe_setuid_drop(void)

{
  return;
}

Assistant:

void safe_setuid_drop(void)
{
#ifdef SETGID
# if defined(HAVE_SETRESGID)

	if (setresgid(-1, getgid(), -1) != 0)
		quit("setegid(): cannot drop permissions correctly!");

# else

	if (setegid(getgid()) != 0)
		quit("setegid(): cannot drop permissions correctly!");

# endif
#endif /* SETGID */
}